

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableMultiplicationGeneralizationImpl.hpp
# Opt level: O0

Result Inferences::VariableMultiplicationGeneralizationImpl::applyRule
                 (Clause *cl,bool doOrderingCheck)

{
  Preprocess f;
  SymbolId obj;
  ComponentIterator i_00;
  EvaluateMonom<Inferences::VariableMultiplicationGeneralizationImpl::Generalize> eval;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined8 extraout_RDX;
  byte in_SIL;
  Clause *in_RDI;
  Result RVar5;
  Elem EVar6;
  RefIterator RVar7;
  Generalize gen;
  AnyNumber<Kernel::MonomFactor> varPower;
  AnyNumber<Kernel::MonomFactor> *__end5;
  AnyNumber<Kernel::MonomFactor> *__begin5;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *__range5;
  Option<Inferences::AnyNumber<Kernel::MonomFactor>_> var_1;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *region;
  VariableRegion *maybeRegion;
  Elem comp;
  StlIter __end2_2;
  StlIter __begin2_2;
  IterTraits<Lib::IntUnionFind::ComponentIterator> *__range2_2;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> remove;
  Elem poly;
  StlIter __end2_1;
  StlIter __begin2_1;
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
  *__range2_1;
  uint i;
  Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion> varRegions;
  IntUnionFind components;
  Elem var;
  StlIter __end2;
  StlIter __begin2;
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>_>
  *__range2;
  IntMap<Kernel::Variable> varMap;
  IntUnionFind *in_stack_fffffffffffffa88;
  StlIter *rhs;
  IntMap<Kernel::Variable> *in_stack_fffffffffffffa90;
  IntMap<Kernel::Variable> *in_stack_fffffffffffffa98;
  AnyNumber<Kernel::MonomFactor> *elem;
  undefined4 in_stack_fffffffffffffaa0;
  uint in_stack_fffffffffffffaa4;
  TermKind in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffaac;
  IntUnionFind *in_stack_fffffffffffffab0;
  undefined8 in_stack_fffffffffffffab8;
  IntUnionFind *in_stack_fffffffffffffac0;
  undefined7 in_stack_fffffffffffffac8;
  undefined1 in_stack_fffffffffffffacf;
  int *in_stack_fffffffffffffad0;
  undefined6 in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffade;
  undefined1 in_stack_fffffffffffffadf;
  Clause *in_stack_fffffffffffffb20;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  Clause *in_stack_fffffffffffffbe0;
  Clause *in_stack_fffffffffffffbe8;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *in_stack_fffffffffffffbf0;
  RefIterator local_3f0;
  IterTraits<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator> local_3e0;
  IterTraits<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>_>
  local_3c8 [3];
  OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_> local_37c;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *local_358;
  VariableRegion *local_350;
  ElementIterator local_348 [5];
  StlIter *local_2f8;
  IntMap<Kernel::Variable> *pIStack_2f0;
  AnyNumber<Kernel::MonomFactor> *local_2e8;
  undefined1 local_2e0 [24];
  undefined1 *local_2c8;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> local_2c0;
  IntUnionFind *local_2a0;
  IntMap<Kernel::Variable> *pIStack_298;
  IntMap<Kernel::Variable> *local_290;
  undefined1 local_230 [136];
  undefined1 *local_1a8;
  uint local_17c;
  undefined1 local_178 [92];
  undefined4 local_11c;
  uint local_118;
  uint local_114;
  undefined1 local_e0 [120];
  undefined1 *local_68;
  IntMap<Kernel::Variable> local_60;
  byte local_19;
  Clause *local_18;
  Clause *local_10;
  undefined1 local_8;
  
  local_19 = in_SIL & 1;
  local_18 = in_RDI;
  IntMap<Kernel::Variable>::IntMap
            ((IntMap<Kernel::Variable> *)
             CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
  Inferences::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),in_stack_fffffffffffffb20
            );
  local_68 = local_e0;
  Lib::
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:77:16)>_>
  ::begin((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>_>
           *)in_stack_fffffffffffffa88);
  Lib::
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:77:16)>_>
  ::end((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>_>
         *)in_stack_fffffffffffffa88);
  while( true ) {
    bVar1 = Lib::operator()((StlIter *)in_stack_fffffffffffffa90,
                            (StlIter *)in_stack_fffffffffffffa88);
    iVar4 = (int)((ulong)in_stack_fffffffffffffab8 >> 0x20);
    if (!bVar1) break;
    local_118 = (uint)Lib::
                      IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:77:16)>_>
                      ::StlIter::operator*((StlIter *)in_stack_fffffffffffffa88);
    obj.kind = in_stack_fffffffffffffaa8;
    obj.functor = in_stack_fffffffffffffaa4;
    local_114 = local_118;
    IntMap<Kernel::Variable>::insert(in_stack_fffffffffffffa98,obj);
    Lib::
    IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:77:16)>_>
    ::StlIter::operator++((StlIter *)in_stack_fffffffffffffab0);
  }
  Lib::
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:77:16)>_>
  ::StlIter::~StlIter((StlIter *)0x72b312);
  Lib::
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:77:16)>_>
  ::StlIter::~StlIter((StlIter *)0x72b31f);
  Lib::
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:77:16)>_>
  ::~IterTraits((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>_>
                 *)0x72b32c);
  uVar2 = IntMap<Kernel::Variable>::size((IntMap<Kernel::Variable> *)0x72b429);
  if (uVar2 == 0) {
    RVar5 = SimplifyingGeneratingInference1::Result::nop(local_18);
    local_10 = RVar5.simplified;
    local_8 = RVar5.premiseRedundant;
    local_11c = 1;
  }
  else {
    IntMap<Kernel::Variable>::size((IntMap<Kernel::Variable> *)0x72b497);
    Lib::IntUnionFind::IntUnionFind(in_stack_fffffffffffffac0,iVar4);
    IntMap<Kernel::Variable>::size((IntMap<Kernel::Variable> *)0x72b4c3);
    Lib::Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion>::Stack
              ((Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion> *)
               CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
               (size_t)in_stack_fffffffffffffa98);
    for (local_17c = 0; uVar2 = local_17c,
        uVar3 = IntMap<Kernel::Variable>::size((IntMap<Kernel::Variable> *)0x72b50c), uVar2 < uVar3;
        local_17c = local_17c + 1) {
      VariableRegion::VariableRegion((VariableRegion *)in_stack_fffffffffffffa90);
      Lib::Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion>::push
                ((Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion> *)
                 CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                 (VariableRegion *)in_stack_fffffffffffffa98);
      VariableRegion::~VariableRegion((VariableRegion *)0x72b55e);
    }
    Inferences::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)
               CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
               in_stack_fffffffffffffb20);
    local_1a8 = local_230;
    Lib::
    IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
    ::begin((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
             *)in_stack_fffffffffffffa88);
    Lib::
    IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
    ::end((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
           *)in_stack_fffffffffffffa88);
    while (bVar1 = Lib::operator()((StlIter *)in_stack_fffffffffffffa90,
                                   (StlIter *)in_stack_fffffffffffffa88), bVar1) {
      Lib::
      IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
      ::StlIter::operator*((StlIter *)in_stack_fffffffffffffa98);
      in_stack_fffffffffffffa88 = (IntUnionFind *)(local_178 + 0x20);
      in_stack_fffffffffffffa90 = &local_60;
      in_stack_fffffffffffffa98 = (IntMap<Kernel::Variable> *)local_178;
      f.components._4_4_ = in_stack_fffffffffffffaa4;
      f.components._0_4_ = in_stack_fffffffffffffaa0;
      f.varMap._0_4_ = in_stack_fffffffffffffaa8;
      f.varMap._4_4_ = in_stack_fffffffffffffaac;
      f.varRegions = (Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion> *)
                     in_stack_fffffffffffffab0;
      local_2a0 = in_stack_fffffffffffffa88;
      pIStack_298 = in_stack_fffffffffffffa90;
      local_290 = in_stack_fffffffffffffa98;
      Lib::
      Coproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
      ::apply<Inferences::VariableMultiplicationGeneralizationImpl::Preprocess>
                ((Coproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
                  *)in_stack_fffffffffffffa90,f);
      Lib::
      IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
      ::StlIter::operator++((StlIter *)in_stack_fffffffffffffac0);
    }
    local_11c = 7;
    Lib::
    IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
    ::StlIter::~StlIter((StlIter *)0x72b66e);
    Lib::
    IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
    ::StlIter::~StlIter((StlIter *)0x72b67b);
    Lib::
    IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
    ::~IterTraits((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
                   *)0x72b688);
    Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::Stack
              ((Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)
               CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
               (size_t)in_stack_fffffffffffffa98);
    Lib::IntUnionFind::evalComponents
              ((IntUnionFind *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
    Lib::IntUnionFind::ComponentIterator::ComponentIterator
              ((ComponentIterator *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    i_00._cit.super_ConstRefIterator._stack._0_7_ = in_stack_fffffffffffffac8;
    i_00._cit.super_ConstRefIterator._pointer = &in_stack_fffffffffffffac0->_cnt;
    i_00._cit.super_ConstRefIterator._stack._7_1_ = in_stack_fffffffffffffacf;
    i_00._data = in_stack_fffffffffffffad0;
    Lib::iterTraits<Lib::IntUnionFind::ComponentIterator>(i_00);
    local_2c8 = local_2e0;
    Lib::IterTraits<Lib::IntUnionFind::ComponentIterator>::begin
              ((IterTraits<Lib::IntUnionFind::ComponentIterator> *)local_2f8);
    Lib::IterTraits<Lib::IntUnionFind::ComponentIterator>::end
              ((IterTraits<Lib::IntUnionFind::ComponentIterator> *)local_2f8);
    rhs = local_2f8;
    in_stack_fffffffffffffa90 = pIStack_2f0;
    elem = local_2e8;
    while( true ) {
      bVar1 = Lib::operator!=((StlIter *)in_stack_fffffffffffffa90,rhs);
      if (!bVar1) break;
      EVar6 = Lib::IterTraits<Lib::IntUnionFind::ComponentIterator>::StlIter::operator*
                        ((StlIter *)0x72b8d9);
      local_348[0]._data = EVar6._data;
      local_348[0]._next = EVar6._next;
      Lib::IntUnionFind::ElementIterator::next(local_348);
      iVar4 = Lib::IntUnionFind::root(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac);
      local_350 = Lib::Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion>::
                  operator[]((Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion>
                              *)local_178,(long)iVar4);
      bVar1 = VariableRegion::isInit((VariableRegion *)0x72b979);
      if (bVar1) {
        local_358 = VariableRegion::unwrap((VariableRegion *)0x72b99f);
        Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::iter
                  ((Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)0x72b9c6);
        RVar7._stack._0_4_ = in_stack_fffffffffffffaa0;
        RVar7._pointer = elem;
        RVar7._stack._4_4_ = in_stack_fffffffffffffaa4;
        RVar7 = (RefIterator)
                Lib::iterTraits<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>::RefIterator>
                          (RVar7);
        local_3f0 = RVar7;
        Lib::IterTraits<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>::RefIterator>::
        map<Inferences::VariableMultiplicationGeneralizationImpl::applyRule(Kernel::Clause*,bool)::__0>
                  (&local_3e0,&local_3f0);
        Lib::
        IterTraits<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>>::RefIterator,Inferences::VariableMultiplicationGeneralizationImpl::applyRule(Kernel::Clause*,bool)::$_0,Inferences::AnyNumber<Kernel::MonomFactor>>>
        ::
        filter<Inferences::VariableMultiplicationGeneralizationImpl::applyRule(Kernel::Clause*,bool)::__1>
                  (local_3c8,&local_3e0);
        Lib::
        IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:267:17),_false>_>
        ::tryNext((IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:267:17),_false>_>
                   *)CONCAT17(in_stack_fffffffffffffadf,
                              CONCAT16(in_stack_fffffffffffffade,in_stack_fffffffffffffad8)));
        Lib::
        IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:267:17),_false>_>
        ::~IterTraits((IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:267:17),_false>_>
                       *)0x72ba8b);
        bVar1 = Lib::OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>::isSome(&local_37c);
        if (bVar1) {
          in_stack_fffffffffffffbf0 = local_358;
          in_stack_fffffffffffffbe8 =
               (Clause *)Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::begin(local_358);
          in_stack_fffffffffffffbe0 =
               (Clause *)
               Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::end
                         (in_stack_fffffffffffffbf0);
          for (; in_stack_fffffffffffffbe8 != in_stack_fffffffffffffbe0;
              in_stack_fffffffffffffbe8 =
                   (Clause *)&(in_stack_fffffffffffffbe8->super_Unit)._inference._ptr1) {
            AnyNumber<Kernel::MonomFactor>::AnyNumber
                      ((AnyNumber<Kernel::MonomFactor> *)in_stack_fffffffffffffa90,
                       (AnyNumber<Kernel::MonomFactor> *)rhs);
            Lib::OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>::unwrap
                      ((OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_> *)0x72bb37);
            in_stack_fffffffffffffadf =
                 Lib::operator!=((Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                  *)in_stack_fffffffffffffa90,
                                 (Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                  *)rhs);
            if ((bool)in_stack_fffffffffffffadf) {
              AnyNumber<Kernel::MonomFactor>::AnyNumber
                        ((AnyNumber<Kernel::MonomFactor> *)in_stack_fffffffffffffa90,
                         (AnyNumber<Kernel::MonomFactor> *)rhs);
              Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::push
                        ((Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)
                         CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),elem);
            }
          }
        }
        Lib::Option<Inferences::AnyNumber<Kernel::MonomFactor>_>::~Option
                  ((Option<Inferences::AnyNumber<Kernel::MonomFactor>_> *)0x72bc00);
      }
      Lib::IterTraits<Lib::IntUnionFind::ComponentIterator>::StlIter::operator++
                ((StlIter *)in_stack_fffffffffffffac0);
    }
    local_11c = 9;
    Lib::IterTraits<Lib::IntUnionFind::ComponentIterator>::StlIter::~StlIter((StlIter *)0x72b86f);
    Lib::IterTraits<Lib::IntUnionFind::ComponentIterator>::StlIter::~StlIter((StlIter *)0x72b87c);
    bVar1 = Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::isEmpty(&local_2c0);
    if (bVar1) {
      RVar5 = SimplifyingGeneratingInference1::Result::nop(local_18);
      local_10 = RVar5.simplified;
      local_8 = RVar5.premiseRedundant;
    }
    else {
      Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::begin(&local_2c0);
      Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::end(&local_2c0);
      std::sort<Inferences::AnyNumber<Kernel::MonomFactor>*>
                ((AnyNumber<Kernel::MonomFactor> *)
                 CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),elem);
      eval.eval._8_8_ = in_stack_fffffffffffffbf0;
      eval.eval.toRem =
           (Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)in_stack_fffffffffffffbe8;
      RVar5 = generalizeBottomUp<Inferences::EvaluateMonom<Inferences::VariableMultiplicationGeneralizationImpl::Generalize>>
                        (in_stack_fffffffffffffbe0,eval);
      local_10 = RVar5.simplified;
      local_8 = RVar5.premiseRedundant;
    }
    local_11c = 1;
    Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::~Stack
              ((Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)in_stack_fffffffffffffa90);
    Lib::Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion>::~Stack
              ((Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion> *)
               in_stack_fffffffffffffa90);
    Lib::IntUnionFind::~IntUnionFind((IntUnionFind *)in_stack_fffffffffffffa90);
  }
  IntMap<Kernel::Variable>::~IntMap(in_stack_fffffffffffffa90);
  RVar5._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  RVar5.premiseRedundant = (bool)local_8;
  RVar5.simplified = local_10;
  return RVar5;
}

Assistant:

SimplifyingGeneratingInference1::Result applyRule(Clause* cl, bool doOrderingCheck) 
{
  DEBUG("input clause: ", *cl);
  IntMap<Variable> varMap;

  /* initialization */
  for (auto var : iterVars(cl)) {
    varMap.insert(var);
  }
  if (varMap.size() == 0) {
    DEBUG("no variables. generalization not applicable");
    return SimplifyingGeneratingInference1::Result::nop(cl);
  }

  IntUnionFind components(varMap.size());
  Stack<VariableRegion> varRegions(varMap.size());;
  for (unsigned i = 0; i < varMap.size(); i++)  {
    varRegions.push(VariableRegion());
  }

  /* preprocessing. finds all products `X0 ⋅ X1 ⋅ ... ⋅ Xn` such that the rule is applicable */
  for (auto poly : iterPolynoms(cl)) {
    poly.apply(Preprocess {components, varMap, varRegions});
  }


  /* create a stack of all variables that shall be removed in the final step */

  Stack<AnyNumber<MonomFactor>> remove;

  components.evalComponents();
  for (auto comp : iterTraits(IntUnionFind::ComponentIterator(components))) {
    auto& maybeRegion = varRegions[components.root(comp.next())];
    if (maybeRegion.isInit()) {
      auto& region = maybeRegion.unwrap();

      /* one variable with power one needs to be kept, per varible region */
      auto var = iterTraits(region.iter())
        .map([](auto& x) { return x; })
        .filter([](auto& p) { return p.apply([](auto& t){ return t.tryVar(); }).isSome(); })
        .tryNext();

      if (var.isSome()) {
        for (auto varPower : region) {
          if (varPower != var.unwrap()) {
            remove.push(varPower);
          }
        }
      }
    }
  }

  /* apply the substitution `X0 ⋅ X1 ⋅ ... ⋅ Xn ==> X0`  */
  DEBUG("removing variables: ", remove)
  if (remove.isEmpty()) {
    return SimplifyingGeneratingInference1::Result::nop(cl);
  } else {
    std::sort(remove.begin(), remove.end());
    Generalize gen { remove, doOrderingCheck };
    return generalizeBottomUp(cl, EvaluateMonom<Generalize> {gen});
  }
}